

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stless_(double *y,int *n,int *len,int *ideg,int *njump,int *userw,double *rw,double *ys,
           double *res)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int local_9c;
  int local_98;
  int nright;
  int newnj;
  int nleft;
  double delta;
  int local_80;
  int nsh;
  int ok;
  int k;
  int j;
  int i__;
  double d__1;
  int local_60;
  int i__3;
  int i__2;
  int i__1;
  int *userw_local;
  int *njump_local;
  int *ideg_local;
  int *len_local;
  int *n_local;
  double *y_local;
  
  n_local = (int *)(y + -1);
  if (*n < 2) {
    *ys = *y;
  }
  else {
    i__3 = *njump;
    local_60 = *n + -1;
    _i__2 = userw;
    userw_local = njump;
    njump_local = ideg;
    ideg_local = len;
    len_local = n;
    local_98 = imin(i__3,local_60);
    if (*ideg_local < *len_local) {
      if (local_98 == 1) {
        delta._4_4_ = (*ideg_local + 1) / 2;
        nright = 1;
        local_9c = *ideg_local;
        local_60 = *len_local;
        for (k = 1; k <= local_60; k = k + 1) {
          if ((delta._4_4_ < k) && (local_9c != *len_local)) {
            nright = nright + 1;
            local_9c = local_9c + 1;
          }
          _j = (double)k;
          stlest_((double *)(n_local + 2),len_local,ideg_local,njump_local,(double *)&j,
                  ys + (long)k + -1,&nright,&local_9c,res,_i__2,rw,&local_80);
          if (local_80 == 0) {
            ys[(long)k + -1] = *(double *)(n_local + (long)k * 2);
          }
        }
      }
      else {
        delta._4_4_ = (*ideg_local + 1) / 2;
        local_60 = *len_local;
        k = 1;
        i__3 = local_98;
        while( true ) {
          if (i__3 < 0) {
            bVar4 = local_60 <= k;
          }
          else {
            bVar4 = k <= local_60;
          }
          if (!bVar4) break;
          if (k < delta._4_4_) {
            nright = 1;
            local_9c = *ideg_local;
          }
          else {
            if (k < (*len_local - delta._4_4_) + 1) {
              iVar5 = k - delta._4_4_;
              local_9c = (*ideg_local + k) - delta._4_4_;
            }
            else {
              iVar5 = *len_local - *ideg_local;
              local_9c = *len_local;
            }
            nright = iVar5 + 1;
          }
          _j = (double)k;
          stlest_((double *)(n_local + 2),len_local,ideg_local,njump_local,(double *)&j,
                  ys + (long)k + -1,&nright,&local_9c,res,_i__2,rw,&local_80);
          if (local_80 == 0) {
            ys[(long)k + -1] = *(double *)(n_local + (long)k * 2);
          }
          k = i__3 + k;
        }
      }
    }
    else {
      nright = 1;
      local_9c = *len_local;
      i__3 = *len_local;
      k = 1;
      local_60 = local_98;
      while( true ) {
        if (local_60 < 0) {
          bVar4 = i__3 <= k;
        }
        else {
          bVar4 = k <= i__3;
        }
        if (!bVar4) break;
        _j = (double)k;
        stlest_((double *)(n_local + 2),len_local,ideg_local,njump_local,(double *)&j,
                ys + (long)k + -1,&nright,&local_9c,res,_i__2,rw,&local_80);
        if (local_80 == 0) {
          ys[(long)k + -1] = *(double *)(n_local + (long)k * 2);
        }
        k = local_60 + k;
      }
    }
    if (local_98 != 1) {
      i__3 = *len_local - local_98;
      local_60 = local_98;
      k = 1;
      while( true ) {
        if (local_98 < 0) {
          bVar4 = i__3 <= k;
        }
        else {
          bVar4 = k <= i__3;
        }
        if (!bVar4) break;
        _newnj = (ys[(long)(k + local_98) + -1] - ys[(long)k + -1]) / (double)local_98;
        d__1._4_4_ = k + local_98 + -1;
        ok = k;
        while (ok = ok + 1, ok <= d__1._4_4_) {
          ys[(long)ok + -1] = _newnj * (double)(ok - k) + ys[(long)k + -1];
        }
        k = local_98 + k;
      }
      nsh = ((*len_local + -1) / local_98) * local_98 + 1;
      if (nsh != *len_local) {
        _j = (double)*len_local;
        stlest_((double *)(n_local + 2),len_local,ideg_local,njump_local,(double *)&j,
                ys + (long)*len_local + -1,&nright,&local_9c,res,_i__2,rw,&local_80);
        if (local_80 == 0) {
          ys[(long)*len_local + -1] = *(double *)(n_local + (long)*len_local * 2);
        }
        if (nsh != *len_local + -1) {
          dVar1 = ys[(long)*len_local + -1];
          dVar2 = ys[(long)nsh + -1];
          iVar5 = *len_local;
          iVar3 = *len_local;
          ok = nsh;
          while (ok = ok + 1, ok <= iVar3 + -1) {
            ys[(long)ok + -1] =
                 ((dVar1 - dVar2) / (double)(iVar5 - nsh)) * (double)(ok - nsh) + ys[(long)nsh + -1]
            ;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int stless_(double *y, int *n, int *len, int *ideg, int *njump, int *userw, double *rw, double *ys,
	 double *res)
{
    /* System generated locals */
    int i__1, i__2, i__3;
    double d__1;

    /* Local variables */
    int i__, j, k;
    int ok;
    int nsh;
    double delta;
    int nleft, newnj, nright;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --res;
    --ys;
    --rw;
    --y;

    /* Function Body */
    if (*n < 2) {
	ys[1] = y[1];
	return 0;
    }
/* Computing MIN */
    i__1 = *njump, i__2 = *n - 1;
    newnj = imin(i__1,i__2);
    if (*len >= *n) {
	nleft = 1;
	nright = *n;
	i__1 = *n;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    d__1 = (double) i__;
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[i__] = y[i__];
	    }
/* L20: */
	}
    } else {
	if (newnj == 1) {
	    nsh = (*len + 1) / 2;
	    nleft = 1;
	    nright = *len;
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		if (i__ > nsh && nright != *n) {
		    ++nleft;
		    ++nright;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L30: */
	    }
	} else {
	    nsh = (*len + 1) / 2;
	    i__2 = *n;
	    i__1 = newnj;
	    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
		if (i__ < nsh) {
		    nleft = 1;
		    nright = *len;
		} else if (i__ >= *n - nsh + 1) {
		    nleft = *n - *len + 1;
		    nright = *n;
		} else {
		    nleft = i__ - nsh + 1;
		    nright = *len + i__ - nsh;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L40: */
	    }
	}
    }
    if (newnj != 1) {
	i__1 = *n - newnj;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    delta = (ys[i__ + newnj] - ys[i__]) / (double) newnj;
	    i__3 = i__ + newnj - 1;
	    for (j = i__ + 1; j <= i__3; ++j) {
		ys[j] = ys[i__] + delta * (double) (j - i__);
/* L47: */
	    }
/* L45: */
	}
	k = (*n - 1) / newnj * newnj + 1;
	if (k != *n) {
	    d__1 = (double) (*n);
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[*n], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[*n] = y[*n];
	    }
	    if (k != *n - 1) {
		delta = (ys[*n] - ys[k]) / (double) (*n - k);
		i__2 = *n - 1;
		for (j = k + 1; j <= i__2; ++j) {
		    ys[j] = ys[k] + delta * (double) (j - k);
/* L55: */
		}
	    }
	}
    }
	return 0;
}